

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<false> * __thiscall
DefaultState<false>::Ignore(DefaultState<false> *this,Context<false> *ctx,SizeType length)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  char *pcVar5;
  stringstream *psVar6;
  ostream *poVar7;
  undefined1 *puVar8;
  void *__s;
  uint in_EDX;
  long in_RSI;
  char *value;
  bool stopInner;
  bool stop;
  int sq_depth;
  int depth;
  char *head;
  int local_30;
  int local_2c;
  char *local_28;
  undefined4 in_stack_ffffffffffffffe0;
  BaseState<false> *local_8;
  
  lVar4 = **(long **)(in_RSI + 0x58) + (ulong)in_EDX;
  pcVar5 = (char *)(lVar4 + 2);
  if ((pcVar5 < *(char **)(in_RSI + 0x60)) && (*pcVar5 == ':')) {
    local_28 = (char *)(lVar4 + 3);
    local_2c = 0;
    local_30 = 0;
    bVar2 = false;
    while (!bVar2) {
      cVar1 = *local_28;
      if (cVar1 == '\0') {
        psVar6 = Context<false>::error_abi_cxx11_
                           ((Context<false> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
        std::operator<<((ostream *)(psVar6 + 0x10),"Found EOF");
        return (BaseState<false> *)0x0;
      }
      if (cVar1 == '\"') {
        bVar3 = false;
        pcVar5 = local_28;
        while (local_28 = pcVar5, !bVar3) {
          pcVar5 = local_28 + 1;
          cVar1 = *pcVar5;
          if (cVar1 == '\0') {
            psVar6 = Context<false>::error_abi_cxx11_
                               ((Context<false> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
            std::operator<<((ostream *)(psVar6 + 0x10),"Found EOF");
            return (BaseState<false> *)0x0;
          }
          if (cVar1 == '\"') {
            bVar3 = true;
          }
          else if (cVar1 == '\\') {
            pcVar5 = local_28 + 2;
          }
        }
      }
      else if (cVar1 == ',') {
        if ((local_2c == 0) && (local_30 == 0)) {
          bVar2 = true;
        }
      }
      else if (cVar1 == '[') {
        local_30 = local_30 + 1;
      }
      else if (cVar1 == ']') {
        if ((local_2c == 0) && (local_30 == 0)) {
          bVar2 = true;
        }
        else {
          local_30 = local_30 + -1;
        }
      }
      else if (cVar1 == '{') {
        local_2c = local_2c + 1;
      }
      else if (cVar1 == '}') {
        if ((local_2c == 0) && (local_30 == 0)) {
          bVar2 = true;
        }
        else {
          local_2c = local_2c + -1;
        }
      }
      local_28 = local_28 + 1;
    }
    lVar4 = **(long **)(in_RSI + 0x58) + (ulong)in_EDX;
    puVar8 = (undefined1 *)(lVar4 + 3);
    if (puVar8 < *(undefined1 **)(in_RSI + 0x60)) {
      *puVar8 = 0x30;
      __s = (void *)(lVar4 + 4);
      memset(__s,0x20,(size_t)(local_28 + (-1 - (long)__s)));
      local_8 = (BaseState<false> *)(in_RSI + 0x120);
    }
    else {
      psVar6 = Context<false>::error_abi_cxx11_
                         ((Context<false> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
      std::operator<<((ostream *)(psVar6 + 0x10),"Found EOF");
      local_8 = (BaseState<false> *)0x0;
    }
  }
  else {
    psVar6 = Context<false>::error_abi_cxx11_
                       ((Context<false> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
    poVar7 = std::operator<<((ostream *)(psVar6 + 0x10),"Expected \':\' found \'");
    poVar7 = std::operator<<(poVar7,*pcVar5);
    std::operator<<(poVar7,"\'");
    local_8 = (BaseState<false> *)0x0;
  }
  return local_8;
}

Assistant:

BaseState<audit>* Ignore(Context<audit>& ctx, rapidjson::SizeType length)
  {
    // fast ignore
    // skip key + \0 + "
    char* head = ctx.stream->src_ + length + 2;
    if (head >= ctx.stream_end || *head != ':')
    {
      ctx.error() << "Expected ':' found '" << *head << "'";
      return nullptr;
    }
    head++;

    // scan for ,}
    // support { { ... } }
    int depth = 0, sq_depth = 0;
    bool stop = false;
    while (!stop)
    {
      switch (*head)
      {
        case '\0':
          ctx.error() << "Found EOF";
          return nullptr;
        case '"':
        {
          // skip strings
          bool stopInner = false;
          while (!stopInner)
          {
            head++;
            switch (*head)
            {
              case '\0':
                ctx.error() << "Found EOF";
                return nullptr;
              case '\\':
                head++;
                break;
              case '"':
                stopInner = true;
                break;
            }
          }
          break;
        }
        case '{':
          depth++;
          break;
        case '}':
          if (depth == 0 && sq_depth == 0)
            stop = true;
          else
            depth--;
          break;
        case '[':
          sq_depth++;
          break;
        case ']':
          if (depth == 0 && sq_depth == 0)
            stop = true;
          else
            sq_depth--;
          break;
        case ',':
          if (depth == 0 && sq_depth == 0)
            stop = true;
          break;
      }
      head++;
    }

    // skip key + \0 + ":
    char* value = ctx.stream->src_ + length + 3;
    if (value >= ctx.stream_end)
    {
      ctx.error() << "Found EOF";
      return nullptr;
    }

    *value = '0';
    value++;
    memset(value, ' ', head - value - 1);

    return &ctx.ignore_state;
  }